

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O2

field_element_t field_div(field_t field,field_element_t l,field_element_t r)

{
  undefined7 in_register_00000009;
  undefined3 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000009,r) == 0 || CONCAT31(in_register_00000011,l) == 0) {
    return '\0';
  }
  return field.exp[((ulong)field.log[l] - (ulong)field.log[r]) + 0xff];
}

Assistant:

static inline field_element_t field_div(field_t field, field_element_t l, field_element_t r) {
    if (l == 0) {
        return 0;
    }

    if (r == 0) {
        // XXX ???
        return 0;
    }

    // division as subtraction of logarithms

    // if rcoeff is larger, then log[l] - log[r] wraps under
    // so, instead, always add 255. in some cases, we'll wrap over, but
    // that's ok because the exp table runs up to 511.
    field_operation_t res = (field_operation_t)255 + (field_operation_t)field.log[l] - (field_operation_t)field.log[r];
    return field.exp[res];
}